

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Chebyshev
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long row;
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double local_40;
  REAL x_local;
  
  if (0 < num) {
    x_local = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (phi);
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (dphi);
    local_40 = 1.0;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_40);
    local_40 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_40);
    if (num != 1) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&x_local);
      local_40 = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      lVar4 = (ulong)(uint)num - 2;
      lVar3 = 2;
      while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
        dVar6 = x_local + x_local;
        row = lVar3 + -1;
        pdVar2 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar1 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(phi,lVar3 + -2,0);
        local_40 = dVar6 * dVar1 - *pdVar2;
        (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20]
        )(phi,lVar3,0,&local_40);
        dVar7 = x_local + x_local;
        pdVar2 = TPZFMatrix<double>::operator()(dphi,0,row);
        dVar1 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar6 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(dphi,0,lVar3 + -2);
        local_40 = (dVar6 + dVar6 + dVar7 * dVar1) - *pdVar2;
        (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(dphi,0,lVar3,&local_40);
        lVar3 = lVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Chebyshev(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
		// Quadratic or higher shape functions
		if(num <= 0) return;
        phi.Zero();
        dphi.Zero();
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, x);
		dphi.Put(0,1, 1.0);
		int ord;
       // dphi.Print("DphisAntes = ",std::cout,EMathematicaInput);
    
		for(ord = 2;ord<num;ord++) {
			phi.Put(ord,0, 2.0*x*phi(ord-1,0) - phi(ord-2,0));
			dphi.Put(0,ord, 2.0*x*dphi(0,ord-1) + 2.0*phi(ord-1,0) - dphi(0,ord-2));
		}
       // dphi.Print("DphisDepois = ",std::cout,EMathematicaInput);
	}